

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int attrset_remove_attr(BigAttrSet *attrset,char *attrname)

{
  BigAttr *pBVar1;
  long lVar2;
  ptrdiff_t ind;
  BigAttr *attr;
  char *attrname_local;
  BigAttrSet *attrset_local;
  
  pBVar1 = attrset_lookup_attr(attrset,attrname);
  if (pBVar1 == (BigAttr *)0x0) {
    _big_file_raise("Attribute name \'%s\' is not found.",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x6a5,attrname);
    attrset_local._4_4_ = -1;
  }
  else {
    lVar2 = (long)pBVar1 - (long)attrset->attrlist >> 5;
    memmove(attrset->attrlist + lVar2,attrset->attrlist + lVar2 + 1,
            ((attrset->listused - lVar2) + -1) * 0x20);
    attrset->listused = attrset->listused - 1;
    attrset_local._4_4_ = 0;
  }
  return attrset_local._4_4_;
}

Assistant:

static int
attrset_remove_attr(BigAttrSet * attrset, const char * attrname)
{
    BigAttr *attr = attrset_lookup_attr(attrset, attrname);
    RAISEIF(attr == NULL,
      ex_notfound,
      "Attribute name '%s' is not found.", attrname
    )
    ptrdiff_t ind = attr - attrset->attrlist;
    memmove(&attrset->attrlist[ind], &attrset->attrlist[ind + 1],
        (attrset->listused - ind - 1) * sizeof(BigAttr));
    attrset->listused -= 1;

    return 0;

ex_notfound:
    return -1;
}